

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sliding_puzzle.cpp
# Opt level: O3

bool __thiscall
sliding_puzzle::SlidingPuzzle::generateSolvableStartState(SlidingPuzzle *this,int soln_lower_bound)

{
  SlidingPuzzleState *__args;
  pointer pvVar1;
  long lVar2;
  int iVar3;
  ostream *poVar4;
  undefined8 uVar5;
  ulong unaff_RBX;
  long lVar6;
  ulong uVar7;
  SlidingPuzzle *pSVar8;
  long lVar9;
  ulong uVar10;
  ulong unaff_R13;
  int iVar11;
  bool bVar12;
  SlidingPuzzleStatePtr rand_state;
  SlidingPuzzleStatePtr new_state;
  undefined1 local_61;
  int local_60;
  undefined4 local_5c;
  SlidingPuzzleStatePtr local_58;
  SlidingPuzzleState *local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  SlidingPuzzle *local_38;
  
  __args = (this->goal_).
           super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  pvVar1 = (__args->state_).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar6 = (long)(__args->state_).
                super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
  if (lVar6 != 0) {
    lVar6 = (lVar6 >> 3) * -0x5555555555555555;
    uVar7 = 0;
    do {
      lVar2 = *(long *)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl;
      lVar9 = (long)*(pointer *)
                     ((long)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl + 8
                     ) - lVar2;
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 2;
        uVar10 = 0;
        do {
          bVar12 = *(int *)(lVar2 + uVar10 * 4) == puzzle_anchor;
          if (bVar12) {
            unaff_R13 = uVar10;
          }
          unaff_R13 = unaff_R13 & 0xffffffff;
          if (bVar12) {
            unaff_RBX = uVar7;
          }
          unaff_RBX = unaff_RBX & 0xffffffff;
          uVar10 = uVar10 + 1;
        } while (lVar9 + (ulong)(lVar9 == 0) != uVar10);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != lVar6 + (ulong)(lVar6 == 0));
    local_5c = (undefined4)unaff_R13;
  }
  local_60 = (int)unaff_RBX;
  local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>,sliding_puzzle::SlidingPuzzleState&>
            (&local_58.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(SlidingPuzzleState **)&local_58,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_48,__args);
  local_48 = (SlidingPuzzleState *)0x0;
  pSVar8 = (SlidingPuzzle *)&stack0xffffffffffffffc0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<sliding_puzzle::SlidingPuzzleState,std::allocator<sliding_puzzle::SlidingPuzzleState>>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pSVar8,&local_48,
             (allocator<sliding_puzzle::SlidingPuzzleState> *)&local_61);
  local_38 = this;
  if (0 < soln_lower_bound) {
    iVar11 = 0;
    do {
      iVar3 = rand();
      bVar12 = generateSuccessorForAction
                         (pSVar8,&local_58,&local_60,(&DAT_0010a792)[iVar3 % 4],local_48);
      if (bVar12) {
        pvVar1 = (local_48->state_).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar6 = (long)(local_48->state_).
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pvVar1;
        if (lVar6 != 0) {
          lVar6 = (lVar6 >> 3) * -0x5555555555555555;
          uVar7 = 0;
          do {
            lVar2 = *(long *)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>._M_impl;
            lVar9 = (long)*(pointer *)
                           ((long)&pvVar1[uVar7].super__Vector_base<int,_std::allocator<int>_>.
                                   _M_impl + 8) - lVar2;
            if (lVar9 != 0) {
              lVar9 = lVar9 >> 2;
              uVar10 = 0;
              do {
                bVar12 = *(int *)(lVar2 + uVar10 * 4) == puzzle_anchor;
                if (bVar12) {
                  unaff_R13 = uVar10;
                }
                unaff_R13 = unaff_R13 & 0xffffffff;
                if (bVar12) {
                  unaff_RBX = uVar7;
                }
                unaff_RBX = unaff_RBX & 0xffffffff;
                uVar10 = uVar10 + 1;
              } while (lVar9 + (ulong)(lVar9 == 0) != uVar10);
            }
            uVar7 = uVar7 + 1;
          } while (uVar7 != lVar6 + (ulong)(lVar6 == 0));
          local_5c = (undefined4)unaff_R13;
        }
        local_60 = (int)unaff_RBX;
        pSVar8 = (SlidingPuzzle *)
                 local_58.
                 super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        std::
        vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
        ::operator=(&(local_58.
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->state_,&local_48->state_);
        iVar11 = iVar11 + 1;
      }
    } while (iVar11 < soln_lower_bound);
  }
  pSVar8 = local_38;
  (local_38->start_).
  super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
       _M_ptr;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
            (&(local_38->start_).
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,
             &local_58.
              super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"The solvable start state is: ",0x1d);
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
  std::ostream::put(-0x28);
  std::ostream::flush();
  poVar4 = operator<<((ostream *)&std::cout,
                      (pSVar8->start_).
                      super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  uVar5 = std::ostream::flush();
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  if (local_58.super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.
               super___shared_ptr<sliding_puzzle::SlidingPuzzleState,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

bool SlidingPuzzle::generateSolvableStartState(int soln_lower_bound)
{
  int anchor_location[2];

  for (int j=0; j<goal_->state_.size(); ++j)
  {
    for (int k=0; k<goal_->state_[j].size(); ++k)
    {
      if (goal_->state_[j][k] == puzzle_anchor)
      {
        anchor_location[0] = j;
        anchor_location[1] = k;
      }
    }
  }

  SlidingPuzzleStatePtr rand_state = std::make_shared<SlidingPuzzleState>(*goal_);
  SlidingPuzzleStatePtr new_state = std::make_shared<SlidingPuzzleState>();

  for (int i=0; i<soln_lower_bound;)
  {
    char successor_action[] = {'N', 'E', 'W', 'S'};
    int rand_ind = rand() % static_cast<int>(4);


    if (generateSuccessorForAction(rand_state,
                                   anchor_location,
                                   successor_action[rand_ind],
                                   *new_state))
    {
      for (int j=0; j<new_state->state_.size(); ++j)
      {
        for (int k=0; k<new_state->state_[j].size(); ++k)
        {
          if (new_state->state_[j][k] == puzzle_anchor)
          {
            anchor_location[0] = j;
            anchor_location[1] = k;
          }
        }
      }

      *rand_state = *new_state;
      ++i;
    }
  }

  start_ = rand_state;

  std::cout << "The solvable start state is: " << std::endl;
  std::cout << *start_ << std::endl;

}